

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regtrav.c
# Opt level: O0

int capture_tree_traverse
              (OnigCaptureTreeNode *node,int at,
              _func_int_int_int_int_int_int_void_ptr *callback_func,int level,void *arg)

{
  int iVar1;
  int local_40;
  int i;
  int r;
  void *arg_local;
  int level_local;
  _func_int_int_int_int_int_int_void_ptr *callback_func_local;
  int at_local;
  OnigCaptureTreeNode *node_local;
  
  if (node == (OnigCaptureTreeNode *)0x0) {
    node_local._4_4_ = 0;
  }
  else if (((at & 1U) == 0) ||
          (node_local._4_4_ = (*callback_func)(node->group,node->beg,node->end,level,1,arg),
          node_local._4_4_ == 0)) {
    for (local_40 = 0; local_40 < node->num_childs; local_40 = local_40 + 1) {
      iVar1 = capture_tree_traverse(node->childs[local_40],at,callback_func,level + 1,arg);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if (((at & 2U) == 0) ||
       (node_local._4_4_ = (*callback_func)(node->group,node->beg,node->end,level,2,arg),
       node_local._4_4_ == 0)) {
      node_local._4_4_ = 0;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int
capture_tree_traverse(OnigCaptureTreeNode* node, int at,
                      int(*callback_func)(int,int,int,int,int,void*),
                      int level, void* arg)
{
  int r, i;

  if (node == (OnigCaptureTreeNode* )0)
    return 0;

  if ((at & ONIG_TRAVERSE_CALLBACK_AT_FIRST) != 0) {
    r = (*callback_func)(node->group, node->beg, node->end,
                         level, ONIG_TRAVERSE_CALLBACK_AT_FIRST, arg);
    if (r != 0) return r;
  }

  for (i = 0; i < node->num_childs; i++) {
    r = capture_tree_traverse(node->childs[i], at,
                              callback_func, level + 1, arg);
    if (r != 0) return r;
  }

  if ((at & ONIG_TRAVERSE_CALLBACK_AT_LAST) != 0) {
    r = (*callback_func)(node->group, node->beg, node->end,
                         level, ONIG_TRAVERSE_CALLBACK_AT_LAST, arg);
    if (r != 0) return r;
  }

  return 0;
}